

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int retval;
  char **argv_local;
  int argc_local;
  
  anon_unknown.dwarf_39a3::SetUp();
  iVar1 = RUN_ALL_TESTS();
  anon_unknown.dwarf_39a3::TestSetValueWithNUL();
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {

  SetUp();

  const int retval = RUN_ALL_TESTS();

  // This has to run last, so we run it manually
  TestSetValueWithNUL();

  return retval;
}